

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O3

string * __thiscall
tinyusdz::usda::USDAReader::get_warning_abi_cxx11_(string *__return_storage_ptr__,USDAReader *this)

{
  Impl *pIVar1;
  pointer pcVar2;
  
  pIVar1 = this->_impl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pIVar1->_warn)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pIVar1->_warn)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string USDAReader::get_warning() { return _impl->GetWarning(); }